

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::CallStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,CallStatement *this)

{
  pointer pPVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_50);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->function);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_30,pPVar1);
  ::std::operator+(&local_50," ",&local_30);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CallStatement::ToString() const {
	string result = "";
	result += "CALL";
	result += " " + function->ToString();
	result += ";";
	return result;
}